

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<char[12],std::__cxx11::string,unsigned_char,int>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,char (*args) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,uchar *args_2,
          int *args_3)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<char[12],std::__cxx11::string,unsigned_char,int>
            ((ostream *)local_1b0,(char *)this,(char (*) [12])fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (uchar *)args_1,(int *)args_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}